

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Array<wchar_t>::~Array(Array<wchar_t> *this)

{
  wchar_t *pwVar1;
  size_t sVar2;
  
  pwVar1 = this->ptr;
  if (pwVar1 != (wchar_t *)0x0) {
    sVar2 = this->size_;
    this->ptr = (wchar_t *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pwVar1,4,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }